

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.h
# Opt level: O3

SampledSpectrum __thiscall pbrt::MediumInteraction::sigma_n(MediumInteraction *this)

{
  long lVar1;
  undefined1 auVar2 [16];
  int i;
  int iVar3;
  long lVar4;
  long in_FS_OFFSET;
  undefined1 auVar5 [16];
  undefined1 auVar6 [64];
  SampledSpectrum SVar7;
  SampledSpectrum sigma_n;
  undefined1 local_18 [16];
  
  auVar5._0_4_ = (this->sigma_s).values.values[0] + (this->sigma_a).values.values[0];
  auVar5._4_4_ = (this->sigma_s).values.values[1] + (this->sigma_a).values.values[1];
  auVar5._8_4_ = (this->sigma_s).values.values[2] + (this->sigma_a).values.values[2];
  auVar5._12_4_ = (this->sigma_s).values.values[3] + (this->sigma_a).values.values[3];
  local_18 = vsubps_avx(*(undefined1 (*) [16])(this->sigma_maj).values.values,auVar5);
  if (sigma_n()::reg == '\0') {
    iVar3 = __cxa_guard_acquire(&sigma_n()::reg);
    if (iVar3 != 0) {
      StatRegisterer::StatRegisterer
                ((StatRegisterer *)&sigma_n()::reg,
                 const::{lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__,(PixelAccumFunc)0x0)
      ;
      __cxa_guard_release(&sigma_n()::reg);
    }
  }
  auVar6 = ZEXT464((uint)local_18._0_4_);
  *(long *)(in_FS_OFFSET + -0x250) = *(long *)(in_FS_OFFSET + -0x250) + 1;
  lVar4 = 1;
  do {
    lVar1 = lVar4 * 4;
    lVar4 = lVar4 + 1;
    auVar5 = vminss_avx(ZEXT416(*(uint *)(local_18 + lVar1)),auVar6._0_16_);
    auVar6 = ZEXT1664(auVar5);
  } while (lVar4 != 4);
  if (auVar5._0_4_ < 0.0) {
    *(long *)(in_FS_OFFSET + -600) = *(long *)(in_FS_OFFSET + -600) + 1;
  }
  auVar5 = vmaxps_avx(local_18,ZEXT416(0) << 0x20);
  auVar2 = vshufpd_avx(auVar5,auVar5,1);
  SVar7.values.values._0_8_ = auVar5._0_8_;
  SVar7.values.values._8_8_ = auVar2._0_8_;
  return (SampledSpectrum)SVar7.values.values;
}

Assistant:

void SetIntersectionProperties(MaterialHandle mtl, LightHandle area,
                                   const MediumInterface *mi, MediumHandle med) {
        material = mtl;
        areaLight = area;
        CHECK_GE(Dot(n, shading.n), 0.);
        // Set medium properties at surface intersection
        if (mi && mi->IsMediumTransition())
            mediumInterface = mi;
        else
            medium = med;
    }